

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError Pa_WriteStream(PaStream *stream,void *buffer,unsigned_long frames)

{
  PaError PVar1;
  int iVar2;
  
  PVar1 = PaUtil_ValidateStreamPointer(stream);
  if (PVar1 == 0) {
    if (frames == 0) {
      PVar1 = 0;
    }
    else if (buffer == (void *)0x0) {
      PVar1 = -0x26f4;
    }
    else {
      iVar2 = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
      if (iVar2 == 0) {
        PVar1 = (**(code **)(*(long *)((long)stream + 0x10) + 0x48))(stream,buffer,frames);
        return PVar1;
      }
      PVar1 = -0x26ff;
      if (iVar2 != 1) {
        PVar1 = iVar2;
      }
    }
  }
  return PVar1;
}

Assistant:

PaError Pa_WriteStream( PaStream* stream,
                        const void *buffer,
                        unsigned long frames )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_WriteStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
    {
        if( frames == 0 )
        {
            /* @todo Should we not allow the implementation to signal any underflow condition? see: http://www.portaudio.com/trac/ticket/116*/
            result = paNoError;
        }
        else if( buffer == 0 )
        {
            result = paBadBufferPtr;
        }
        else
        {
            result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
            if( result == 0 )
            {
                result = PA_STREAM_INTERFACE(stream)->Write( stream, buffer, frames );
            }
            else if( result == 1 )
            {
                result = paStreamIsStopped;
            }
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_WriteStream", result );

    return result;
}